

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::
emplace_back<slang::ast::PortSymbol::NetTypeRange>
          (SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *this,NetTypeRange *args)

{
  ulong uVar1;
  pointer p;
  undefined8 uVar2;
  bitwidth_t bVar3;
  undefined4 uVar4;
  pointer pNVar5;
  pointer pNVar6;
  pointer pNVar7;
  long lVar8;
  long lVar9;
  pointer __src;
  size_type sVar10;
  ulong uVar11;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    bVar3 = args->width;
    uVar4 = *(undefined4 *)&args->field_0xc;
    __src->netType = args->netType;
    __src->width = bVar3;
    *(undefined4 *)&__src->field_0xc = uVar4;
    sVar10 = this->len;
    this->len = sVar10 + 1;
    return this->data_ + sVar10;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar11 = this->len + 1;
  uVar1 = this->cap;
  if (uVar11 < uVar1 * 2) {
    uVar11 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar11 = 0x7ffffffffffffff;
  }
  lVar9 = (long)__src - (long)this->data_;
  pNVar5 = (pointer)operator_new(uVar11 << 4);
  uVar2 = *(undefined8 *)&args->width;
  *(undefined8 *)((long)pNVar5 + lVar9) = args->netType;
  ((undefined8 *)((long)pNVar5 + lVar9))[1] = uVar2;
  p = this->data_;
  sVar10 = this->len;
  lVar8 = (long)p + (sVar10 * 0x10 - (long)__src);
  pNVar6 = p;
  pNVar7 = pNVar5;
  if (lVar8 == 0) {
    pNVar6 = pNVar5;
    pNVar7 = p;
    if (sVar10 != 0) {
      do {
        bVar3 = pNVar7->width;
        uVar4 = *(undefined4 *)&pNVar7->field_0xc;
        pNVar6->netType = pNVar7->netType;
        pNVar6->width = bVar3;
        *(undefined4 *)&pNVar6->field_0xc = uVar4;
        pNVar7 = pNVar7 + 1;
        pNVar6 = pNVar6 + 1;
      } while (pNVar7 != __src);
    }
  }
  else {
    for (; pNVar6 != __src; pNVar6 = pNVar6 + 1) {
      bVar3 = pNVar6->width;
      uVar4 = *(undefined4 *)&pNVar6->field_0xc;
      pNVar7->netType = pNVar6->netType;
      pNVar7->width = bVar3;
      *(undefined4 *)&pNVar7->field_0xc = uVar4;
      pNVar7 = pNVar7 + 1;
    }
    memcpy((void *)((long)pNVar5 + lVar9 + 0x10),__src,(lVar8 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar10 = this->len;
  }
  this->len = sVar10 + 1;
  this->cap = uVar11;
  this->data_ = pNVar5;
  return (reference)((long)pNVar5 + lVar9);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }